

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

cs_err cs_close(csh *handle)

{
  void *__s;
  cs_err cVar1;
  
  __s = (void *)*handle;
  if (__s == (void *)0x0) {
    cVar1 = CS_ERR_CSH;
  }
  else {
    if (*(void **)((long)__s + 0x10) != (void *)0x0) {
      (*cs_mem_free)(*(void **)((long)__s + 0x10));
    }
    (*cs_mem_free)(*(void **)((long)__s + 0xf0));
    cVar1 = CS_ERR_OK;
    memset(__s,0,0x128);
    (*cs_mem_free)(__s);
    *handle = 0;
  }
  return cVar1;
}

Assistant:

CAPSTONE_EXPORT
cs_err cs_close(csh *handle)
{
	struct cs_struct *ud;

	if (*handle == 0)
		// invalid handle
		return CS_ERR_CSH;

	ud = (struct cs_struct *)(*handle);

	if (ud->printer_info)
		cs_mem_free(ud->printer_info);

	cs_mem_free(ud->insn_cache);

	memset(ud, 0, sizeof(*ud));
	cs_mem_free(ud);

	// invalidate this handle by ZERO out its value.
	// this is to make sure it is unusable after cs_close()
	*handle = 0;

	return CS_ERR_OK;
}